

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  string *source;
  cmake *this_00;
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  string path;
  cmListFileContext lfc;
  ostringstream msg;
  cmOutputConverter converter;
  allocator local_27a;
  allocator local_279;
  string local_278;
  char *local_258;
  string local_250;
  string local_230;
  cmListFileContext local_210;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  long local_188;
  ios_base local_158 [264];
  cmOutputConverter local_50;
  
  if (this->WarnUnused != true) {
    return;
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_210.Name._M_dataplus._M_p = (pointer)&local_210.Name.field_2;
  local_210.Name._M_string_length = 0;
  local_210.Name.field_2._M_local_buf[0] = '\0';
  source = &local_210.FilePath;
  local_210.FilePath._M_dataplus._M_p = (pointer)&local_210.FilePath.field_2;
  local_210.FilePath._M_string_length = 0;
  local_210.FilePath.field_2._M_local_buf[0] = '\0';
  local_210.Line = 0;
  local_258 = reason;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar4 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
    sVar1 = local_278._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_278,0,(char *)sVar1,(ulong)pcVar4);
    std::__cxx11::string::append((char *)&local_278);
    std::__cxx11::string::_M_assign((string *)source);
    local_210.Line = 0;
  }
  else {
    GetExecutionContext((cmListFileContext *)local_1c8,this);
    std::__cxx11::string::operator=((string *)&local_210,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)source,(string *)&local_1a8);
    local_210.Line = local_188;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_278);
  }
  cmOutputConverter::cmOutputConverter(&local_50,this->StateSnapshot);
  cmOutputConverter::Convert((string *)local_1c8,&local_50,source,HOME,UNCHANGED);
  std::__cxx11::string::operator=((string *)source,(string *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pcVar4 = local_258;
  if (this->CheckSystemVars == false) {
    pcVar5 = cmake::GetHomeDirectory(this->LocalGenerator->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)local_1c8,pcVar5,&local_279);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&local_278,(string *)local_1c8);
    bVar3 = true;
    if (!bVar2) {
      pcVar5 = cmake::GetHomeOutputDirectory(this->LocalGenerator->GlobalGenerator->CMakeInstance);
      std::__cxx11::string::string((string *)&local_250,pcVar5,&local_27a);
      bVar3 = cmsys::SystemTools::IsSubDirectory(&local_278,&local_250);
      if (bVar3) {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/CMakeFiles","");
        bVar3 = cmsys::SystemTools::IsSubDirectory(&local_278,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        bVar3 = !bVar3;
        pcVar4 = local_258;
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (!bVar3) goto LAB_00327a31;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"unused variable (",0x11);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffd68 + (int)*(undefined8 *)(local_1c8._0_8_ + -0x18) +
                    0xd0);
  }
  else {
    sVar6 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar4,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,") \'",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
  this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
  std::__cxx11::stringbuf::str();
  cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_250,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
LAB_00327a31:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.FilePath._M_dataplus._M_p != &local_210.FilePath.field_2) {
    operator_delete(local_210.FilePath._M_dataplus._M_p,
                    CONCAT71(local_210.FilePath.field_2._M_allocated_capacity._1_7_,
                             local_210.FilePath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.Name._M_dataplus._M_p != &local_210.Name.field_2) {
    operator_delete(local_210.Name._M_dataplus._M_p,
                    CONCAT71(local_210.Name.field_2._M_allocated_capacity._1_7_,
                             local_210.Name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason,
                                const std::string& name) const
{
  if (this->WarnUnused)
    {
    std::string path;
    cmListFileContext lfc;
    if (!this->CallStack.empty())
      {
      lfc = this->GetExecutionContext();
      path = lfc.FilePath;
      }
    else
      {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
      lfc.FilePath = path;
      lfc.Line = 0;
      }
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeOutputDirectory()) &&
        !cmSystemTools::IsSubDirectory(path,
                                cmake::GetCMakeFilesDirectory())))
      {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                             msg.str(),
                                             lfc);
      }
    }
}